

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bn_add.c
# Opt level: O2

int BN_sub(BIGNUM *r,BIGNUM *a,BIGNUM *b)

{
  int iVar1;
  int iVar2;
  BIGNUM *pBVar3;
  BIGNUM *b_00;
  BIGNUM *a_00;
  
  if (a->neg == 0) {
    iVar1 = 0;
    b_00 = b;
    a_00 = a;
    if (b->neg != 0) goto LAB_001260af;
  }
  else {
    b_00 = a;
    a_00 = b;
    if (b->neg == 0) {
      iVar1 = 1;
LAB_001260af:
      iVar2 = BN_uadd(r,a,b);
      if (iVar2 == 0) {
        return 0;
      }
      goto LAB_001260d4;
    }
  }
  iVar1 = b_00->top;
  if (b_00->top < a_00->top) {
    iVar1 = a_00->top;
  }
  pBVar3 = bn_wexpand((BIGNUM *)r,iVar1);
  if (pBVar3 == (BIGNUM *)0x0) {
    return 0;
  }
  iVar1 = BN_ucmp(a_00,b_00);
  if (iVar1 < 0) {
    iVar1 = BN_usub(r,b_00,a_00);
    if (iVar1 == 0) {
      return 0;
    }
    iVar1 = 1;
  }
  else {
    iVar2 = BN_usub(r,a_00,b_00);
    iVar1 = 0;
    if (iVar2 == 0) {
      return 0;
    }
  }
LAB_001260d4:
  r->neg = iVar1;
  return 1;
}

Assistant:

int BN_sub(BIGNUM *r, const BIGNUM *a, const BIGNUM *b)
{
    int max;
    int add = 0, neg = 0;

    bn_check_top(a);
    bn_check_top(b);

    /*-
     *  a -  b      a-b
     *  a - -b      a+b
     * -a -  b      -(a+b)
     * -a - -b      b-a
     */
    if (a->neg) {
        if (b->neg) {
            const BIGNUM *tmp;

            tmp = a;
            a = b;
            b = tmp;
        } else {
            add = 1;
            neg = 1;
        }
    } else {
        if (b->neg) {
            add = 1;
            neg = 0;
        }
    }

    if (add) {
        if (!BN_uadd(r, a, b))
            return 0;
        r->neg = neg;
        return 1;
    }

    /* We are actually doing a - b :-) */

    max = (a->top > b->top) ? a->top : b->top;
    if (bn_wexpand(r, max) == NULL)
        return 0;
    if (BN_ucmp(a, b) < 0) {
        if (!BN_usub(r, b, a))
            return 0;
        r->neg = 1;
    } else {
        if (!BN_usub(r, a, b))
            return 0;
        r->neg = 0;
    }
    bn_check_top(r);
    return 1;
}